

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten.cpp
# Opt level: O0

int __thiscall ncnn::Flatten::forward(Flatten *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  Mat *in_RDX;
  long in_RSI;
  int i;
  float *outptr;
  float *ptr;
  int q;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *in_stack_ffffffffffffff40;
  Mat *this_00;
  Mat *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int iVar3;
  undefined8 in_stack_ffffffffffffff58;
  Mat *in_stack_ffffffffffffff60;
  Mat local_90;
  Mat *local_50;
  int local_48;
  int local_44;
  undefined8 local_40;
  int local_34;
  int local_30;
  int local_2c;
  Mat *local_20;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x34);
  local_40 = *(undefined8 *)(in_RSI + 0x10);
  local_44 = local_2c * local_30;
  local_20 = in_RDX;
  Mat::create(in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
              (Allocator *)in_stack_ffffffffffffff48);
  bVar1 = Mat::empty(in_stack_ffffffffffffff40);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    for (local_48 = 0; local_48 < local_34; local_48 = local_48 + 1) {
      this_00 = &local_90;
      Mat::channel(in_stack_ffffffffffffff48,(int)((ulong)this_00 >> 0x20));
      in_stack_ffffffffffffff48 = (Mat *)Mat::operator_cast_to_float_(this_00);
      Mat::~Mat((Mat *)0x145b92);
      local_50 = in_stack_ffffffffffffff48;
      pfVar2 = Mat::operator_cast_to_float_(local_20);
      for (iVar3 = 0; iVar3 < local_44; iVar3 = iVar3 + 1) {
        pfVar2[(long)(local_44 * local_48) + (long)iVar3] =
             *(float *)((long)&local_50->data + (long)iVar3 * 4);
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Flatten::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(size * channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);
        float* outptr = (float*)top_blob + size * q;

        for (int i=0; i<size; i++)
        {
            outptr[i] = ptr[i];
        }
    }

    return 0;
}